

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O2

bool __thiscall
wallet::CCrypter::SetKeyFromPassphrase
          (CCrypter *this,SecureString *key_data,
          span<const_unsigned_char,_18446744073709551615UL> salt,uint rounds,uint derivation_method)

{
  long lVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (salt._M_extent._M_extent_value._M_extent_value == 8 && rounds != 0) {
    if (derivation_method == 0) {
      salt_00._M_extent._M_extent_value = 8;
      salt_00._M_ptr = salt._M_ptr;
      iVar4 = BytesToKeySHA512AES(this,salt_00,key_data,rounds,
                                  (this->vchKey).
                                  super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (this->vchIV).
                                  super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      if (iVar4 == 0x20) {
        this->fKeySet = true;
        bVar3 = true;
        goto LAB_0049ff72;
      }
    }
    puVar2 = (this->vchKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    memory_cleanse(puVar2,(long)(this->vchKey).
                                super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
    puVar2 = (this->vchIV).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    memory_cleanse(puVar2,(long)(this->vchIV).
                                super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
  }
  bVar3 = false;
LAB_0049ff72:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CCrypter::SetKeyFromPassphrase(const SecureString& key_data, const std::span<const unsigned char> salt, const unsigned int rounds, const unsigned int derivation_method)
{
    if (rounds < 1 || salt.size() != WALLET_CRYPTO_SALT_SIZE) {
        return false;
    }

    int i = 0;
    if (derivation_method == 0) {
        i = BytesToKeySHA512AES(salt, key_data, rounds, vchKey.data(), vchIV.data());
    }

    if (i != (int)WALLET_CRYPTO_KEY_SIZE)
    {
        memory_cleanse(vchKey.data(), vchKey.size());
        memory_cleanse(vchIV.data(), vchIV.size());
        return false;
    }

    fKeySet = true;
    return true;
}